

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O1

ScalarFunction * duckdb::NotLikeFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff14;
  FunctionNullHandling in_stack_ffffffffffffff20;
  allocator_type local_d9;
  code *bind_lambda;
  LogicalType local_b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_a0;
  string local_88;
  LogicalType local_68;
  LogicalType local_50 [2];
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"!~~","");
  LogicalType::LogicalType(local_50,VARCHAR);
  LogicalType::LogicalType(local_50 + 1,VARCHAR);
  __l._M_len = 2;
  __l._M_array = local_50;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_a0,__l,&local_d9);
  LogicalType::LogicalType(&local_b8,BOOLEAN);
  bind_lambda = RegularLikeFunction<duckdb::NotLikeOperator,true>;
  LogicalType::LogicalType(&local_68,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_68;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff0c;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff14;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_88,(vector<duckdb::LogicalType,_true> *)&local_a0,&local_b8,
             (scalar_function_t *)&stack0xffffffffffffff28,LikeBindFunction,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_ffffffffffffff20,bind_lambda);
  LogicalType::~LogicalType(&local_68);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xffffffffffffff28,(_Any_data *)&stack0xffffffffffffff28,
               __destroy_functor);
  LogicalType::~LogicalType(&local_b8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_a0);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_50[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  (in_RDI->super_BaseScalarFunction).collation_handling = PUSH_COMBINABLE_COLLATIONS;
  return in_RDI;
}

Assistant:

ScalarFunction NotLikeFun::GetFunction() {
	ScalarFunction not_like("!~~", {LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::BOOLEAN,
	                        RegularLikeFunction<NotLikeOperator, true>, LikeBindFunction);
	not_like.collation_handling = FunctionCollationHandling::PUSH_COMBINABLE_COLLATIONS;
	return not_like;
}